

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

_Bool printSysAlias(MCInst *MI,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  int iVar3;
  int iVar4;
  uint RegNo;
  MCOperand *pMVar5;
  MCOperand *op;
  MCOperand *op_00;
  MCOperand *op_01;
  int64_t iVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  int local_64;
  uint Reg;
  uint op_tlbi;
  uint op_at;
  uint op_dc;
  uint op_ic;
  uint insn_id;
  uint Op2Val;
  uint CmVal;
  uint CnVal;
  uint Op1Val;
  MCOperand *Op2;
  MCOperand *Cm;
  MCOperand *Cn;
  MCOperand *Op1;
  char *Asm;
  SStream *O_local;
  MCInst *MI_local;
  
  Op1 = (MCOperand *)0x0;
  pMVar5 = MCInst_getOperand(MI,0);
  op = MCInst_getOperand(MI,1);
  op_00 = MCInst_getOperand(MI,2);
  op_01 = MCInst_getOperand(MI,3);
  iVar6 = MCOperand_getImm(pMVar5);
  iVar3 = (int)iVar6;
  iVar6 = MCOperand_getImm(op);
  uVar7 = MCOperand_getImm(op_00);
  uVar8 = MCOperand_getImm(op_01);
  iVar4 = (int)uVar8;
  op_at = 0;
  op_tlbi = 0;
  Reg = 0;
  local_64 = 0;
  if ((int)iVar6 == 7) {
    switch((int)uVar7) {
    case 1:
      if ((iVar3 == 0) && (iVar4 == 0)) {
        Op1 = (MCOperand *)anon_var_dwarf_41bbb;
        op_dc = 0x1c0;
        op_at = 1;
      }
      break;
    default:
      break;
    case 4:
      if ((iVar3 == 3) && (iVar4 == 1)) {
        Op1 = (MCOperand *)anon_var_dwarf_41c00;
        op_dc = 0x1c1;
        op_tlbi = 1;
      }
      break;
    case 5:
      if ((iVar3 == 0) && (iVar4 == 0)) {
        Op1 = (MCOperand *)anon_var_dwarf_41bd2;
        op_dc = 0x1c0;
        op_at = 2;
      }
      else if ((iVar3 == 3) && (iVar4 == 1)) {
        Op1 = (MCOperand *)anon_var_dwarf_41be9;
        op_dc = 0x1c0;
        op_at = 3;
      }
      break;
    case 6:
      if ((iVar3 == 0) && (iVar4 == 1)) {
        Op1 = (MCOperand *)anon_var_dwarf_41c17;
        op_dc = 0x1c1;
        op_tlbi = 2;
      }
      if ((iVar3 == 0) && (iVar4 == 2)) {
        Op1 = (MCOperand *)anon_var_dwarf_41c22;
        op_dc = 0x1c1;
        op_tlbi = 3;
      }
      break;
    case 8:
      if (iVar3 == 0) {
        switch(uVar8 & 0xffffffff) {
        case 0:
          Op1 = (MCOperand *)anon_var_dwarf_41c64;
          op_dc = 0x1c2;
          Reg = 0;
          break;
        case 1:
          Op1 = (MCOperand *)anon_var_dwarf_41c6f;
          op_dc = 0x1c2;
          Reg = 1;
          break;
        case 2:
          Op1 = (MCOperand *)anon_var_dwarf_41c7a;
          op_dc = 0x1c2;
          Reg = 2;
          break;
        case 3:
          Op1 = (MCOperand *)anon_var_dwarf_41c85;
          op_dc = 0x1c2;
          Reg = 3;
        }
      }
      else if (iVar3 == 4) {
        switch(uVar8 & 0xffffffff) {
        case 0:
          Op1 = (MCOperand *)anon_var_dwarf_41c90;
          op_dc = 0x1c2;
          Reg = 4;
          break;
        case 1:
          Op1 = (MCOperand *)anon_var_dwarf_41c9b;
          op_dc = 0x1c2;
          Reg = 5;
          break;
        default:
          break;
        case 4:
          Op1 = (MCOperand *)anon_var_dwarf_41ca6;
          op_dc = 0x1c2;
          Reg = 0;
          break;
        case 5:
          Op1 = (MCOperand *)anon_var_dwarf_41cb1;
          op_dc = 0x1c2;
          Reg = 1;
          break;
        case 6:
          Op1 = (MCOperand *)anon_var_dwarf_41cbc;
          op_dc = 0x1c2;
          Reg = 2;
          break;
        case 7:
          Op1 = (MCOperand *)anon_var_dwarf_41cc7;
          op_dc = 0x1c2;
          Reg = 3;
        }
      }
      else if (iVar3 == 6) {
        if (iVar4 == 0) {
          Op1 = (MCOperand *)anon_var_dwarf_41cd2;
          op_dc = 0x1c2;
          Reg = 10;
        }
        else if (iVar4 == 1) {
          Op1 = (MCOperand *)anon_var_dwarf_41cdd;
          op_dc = 0x1c2;
          Reg = 0xb;
        }
      }
      break;
    case 10:
      if ((iVar3 == 3) && (iVar4 == 1)) {
        Op1 = (MCOperand *)anon_var_dwarf_41c2d;
        op_dc = 0x1c1;
        op_tlbi = 4;
      }
      else if ((iVar3 == 0) && (iVar4 == 2)) {
        Op1 = (MCOperand *)anon_var_dwarf_41c38;
        op_dc = 0x1c1;
        op_tlbi = 5;
      }
      break;
    case 0xb:
      if ((iVar3 == 3) && (iVar4 == 1)) {
        Op1 = (MCOperand *)anon_var_dwarf_41c43;
        op_dc = 0x1c1;
        op_tlbi = 6;
      }
      break;
    case 0xe:
      if ((iVar3 == 3) && (iVar4 == 1)) {
        Op1 = (MCOperand *)anon_var_dwarf_41c4e;
        op_dc = 0x1c1;
        op_tlbi = 7;
      }
      else if ((iVar3 == 0) && (iVar4 == 2)) {
        Op1 = (MCOperand *)anon_var_dwarf_41c59;
        op_dc = 0x1c1;
        op_tlbi = 8;
      }
    }
  }
  else if ((int)iVar6 == 8) {
    switch(uVar7 & 0xffffffff) {
    case 0:
      if (iVar3 == 4) {
        if (iVar4 == 1) {
          Op1 = (MCOperand *)anon_var_dwarf_41d9a;
          op_dc = 0x1c3;
          local_64 = 0xf;
        }
        else if (iVar4 == 5) {
          Op1 = (MCOperand *)anon_var_dwarf_41da5;
          op_dc = 0x1c3;
          local_64 = 0x10;
        }
      }
      break;
    default:
      break;
    case 3:
      if (iVar3 == 0) {
        switch(uVar8 & 0xffffffff) {
        case 0:
          Op1 = (MCOperand *)anon_var_dwarf_41ce8;
          op_dc = 0x1c3;
          local_64 = 1;
          break;
        case 1:
          Op1 = (MCOperand *)anon_var_dwarf_41cf3;
          op_dc = 0x1c3;
          local_64 = 2;
          break;
        case 2:
          Op1 = (MCOperand *)anon_var_dwarf_41cfe;
          op_dc = 0x1c3;
          local_64 = 3;
          break;
        case 3:
          Op1 = (MCOperand *)anon_var_dwarf_41d15;
          op_dc = 0x1c3;
          local_64 = 4;
          break;
        default:
          break;
        case 5:
          Op1 = (MCOperand *)anon_var_dwarf_41d20;
          op_dc = 0x1c3;
          local_64 = 5;
          break;
        case 7:
          Op1 = (MCOperand *)anon_var_dwarf_41d2b;
          op_dc = 0x1c3;
          local_64 = 6;
        }
      }
      else if (iVar3 == 4) {
        switch(uVar8 & 0xffffffff) {
        case 0:
          Op1 = (MCOperand *)anon_var_dwarf_41d36;
          op_dc = 0x1c3;
          local_64 = 7;
          break;
        case 1:
          Op1 = (MCOperand *)anon_var_dwarf_41d41;
          op_dc = 0x1c3;
          local_64 = 8;
          break;
        default:
          break;
        case 4:
          Op1 = (MCOperand *)anon_var_dwarf_41d4c;
          op_dc = 0x1c3;
          local_64 = 9;
          break;
        case 5:
          Op1 = (MCOperand *)anon_var_dwarf_41d57;
          op_dc = 0x1c3;
          local_64 = 10;
          break;
        case 6:
          Op1 = (MCOperand *)anon_var_dwarf_41d62;
          op_dc = 0x1c3;
          local_64 = 0xb;
        }
      }
      else if (iVar3 == 6) {
        if (iVar4 == 0) {
          Op1 = (MCOperand *)anon_var_dwarf_41d79;
          op_dc = 0x1c3;
          local_64 = 0xc;
        }
        else if (iVar4 == 1) {
          Op1 = (MCOperand *)anon_var_dwarf_41d84;
          op_dc = 0x1c3;
          local_64 = 0xd;
        }
        else if (iVar4 == 5) {
          Op1 = (MCOperand *)anon_var_dwarf_41d8f;
          op_dc = 0x1c3;
          local_64 = 0xe;
        }
      }
      break;
    case 4:
      if (iVar3 == 4) {
        if (iVar4 == 1) {
          Op1 = (MCOperand *)anon_var_dwarf_41dbc;
          op_dc = 0x1c3;
          local_64 = 0x11;
        }
        else if (iVar4 == 5) {
          Op1 = (MCOperand *)anon_var_dwarf_41dc7;
          op_dc = 0x1c3;
          local_64 = 0x12;
        }
      }
      break;
    case 7:
      if (iVar3 == 0) {
        switch(uVar8 & 0xffffffff) {
        case 0:
          Op1 = (MCOperand *)anon_var_dwarf_41dd2;
          op_dc = 0x1c3;
          local_64 = 0x13;
          break;
        case 1:
          Op1 = (MCOperand *)anon_var_dwarf_41ddd;
          op_dc = 0x1c3;
          local_64 = 0x14;
          break;
        case 2:
          Op1 = (MCOperand *)anon_var_dwarf_41de8;
          op_dc = 0x1c3;
          local_64 = 0x15;
          break;
        case 3:
          Op1 = (MCOperand *)anon_var_dwarf_41df3;
          op_dc = 0x1c3;
          local_64 = 0x16;
          break;
        default:
          break;
        case 5:
          Op1 = (MCOperand *)anon_var_dwarf_41dfe;
          op_dc = 0x1c3;
          local_64 = 0x17;
          break;
        case 7:
          Op1 = (MCOperand *)anon_var_dwarf_41e09;
          op_dc = 0x1c3;
          local_64 = 0x18;
        }
      }
      else if (iVar3 == 4) {
        switch(uVar8 & 0xffffffff) {
        case 0:
          Op1 = (MCOperand *)anon_var_dwarf_41e14;
          op_dc = 0x1c3;
          local_64 = 0x19;
          break;
        case 1:
          Op1 = (MCOperand *)anon_var_dwarf_41e1f;
          op_dc = 0x1c3;
          local_64 = 0x1a;
          break;
        default:
          break;
        case 4:
          Op1 = (MCOperand *)anon_var_dwarf_41e2a;
          op_dc = 0x1c3;
          local_64 = 0x1b;
          break;
        case 5:
          Op1 = (MCOperand *)anon_var_dwarf_41e35;
          op_dc = 0x1c3;
          local_64 = 0x1c;
          break;
        case 6:
          Op1 = (MCOperand *)anon_var_dwarf_41e40;
          op_dc = 0x1c3;
          local_64 = 0x1d;
        }
      }
      else if (iVar3 == 6) {
        if (iVar4 == 0) {
          Op1 = (MCOperand *)anon_var_dwarf_41e4b;
          op_dc = 0x1c3;
          local_64 = 0x1e;
        }
        else if (iVar4 == 1) {
          Op1 = (MCOperand *)anon_var_dwarf_41e56;
          op_dc = 0x1c3;
          local_64 = 0x1f;
        }
        else if (iVar4 == 5) {
          Op1 = (MCOperand *)anon_var_dwarf_41e61;
          op_dc = 0x1c3;
          local_64 = 0x20;
        }
      }
    }
  }
  if (Op1 != (MCOperand *)0x0) {
    MCInst_setOpcodePub(MI,op_dc);
    SStream_concat0(O,(char *)Op1);
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
      puVar1[0] = 'D';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) =
           op_at + op_tlbi + Reg + local_64;
      pcVar2 = MI->flat_insn->detail;
      (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
    }
    pcVar9 = strstr((char *)Op1,"all");
    if (pcVar9 == (char *)0x0) {
      pMVar5 = MCInst_getOperand(MI,4);
      RegNo = MCOperand_getReg(pMVar5);
      pcVar9 = getRegisterName(RegNo,0);
      SStream_concat(O,", %s",pcVar9);
      if (MI->csh->detail != CS_OPT_OFF) {
        puVar1 = MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        *(uint *)(MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = RegNo;
        pcVar2 = MI->flat_insn->detail;
        (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
      }
    }
  }
  return Op1 != (MCOperand *)0x0;
}

Assistant:

static bool printSysAlias(MCInst *MI, SStream *O)
{
	// unsigned Opcode = MCInst_getOpcode(MI);
	//assert(Opcode == AArch64_SYSxt && "Invalid opcode for SYS alias!");

	char *Asm = NULL;
	MCOperand *Op1 = MCInst_getOperand(MI, 0);
	MCOperand *Cn = MCInst_getOperand(MI, 1);
	MCOperand *Cm = MCInst_getOperand(MI, 2);
	MCOperand *Op2 = MCInst_getOperand(MI, 3);

	unsigned Op1Val = (unsigned)MCOperand_getImm(Op1);
	unsigned CnVal = (unsigned)MCOperand_getImm(Cn);
	unsigned CmVal = (unsigned)MCOperand_getImm(Cm);
	unsigned Op2Val = (unsigned)MCOperand_getImm(Op2);
	unsigned insn_id, op_ic = 0, op_dc = 0, op_at = 0, op_tlbi = 0;

	if (CnVal == 7) {
		switch (CmVal) {
			default:
				break;

				// IC aliases
			case 1:
				if (Op1Val == 0 && Op2Val == 0) {
					Asm = "ic\tialluis";
					insn_id = ARM64_INS_IC;
					op_ic = ARM64_IC_IALLUIS;
				}
				break;
			case 5:
				if (Op1Val == 0 && Op2Val == 0) {
					Asm = "ic\tiallu";
					insn_id = ARM64_INS_IC;
					op_ic = ARM64_IC_IALLU;
				} else if (Op1Val == 3 && Op2Val == 1) {
					Asm = "ic\tivau";
					insn_id = ARM64_INS_IC;
					op_ic = ARM64_IC_IVAU;
				}
				break;

				// DC aliases
			case 4:
				if (Op1Val == 3 && Op2Val == 1) {
					Asm = "dc\tzva";
					insn_id = ARM64_INS_DC;
					op_dc = ARM64_DC_ZVA;
				}
				break;
			case 6:
				if (Op1Val == 0 && Op2Val == 1) {
					Asm = "dc\tivac";
					insn_id = ARM64_INS_DC;
					op_dc = ARM64_DC_IVAC;
				}
				if (Op1Val == 0 && Op2Val == 2) {
					Asm = "dc\tisw";
					insn_id = ARM64_INS_DC;
					op_dc = ARM64_DC_ISW;
				}
				break;
			case 10:
				if (Op1Val == 3 && Op2Val == 1) {
					Asm = "dc\tcvac";
					insn_id = ARM64_INS_DC;
					op_dc = ARM64_DC_CVAC;
				} else if (Op1Val == 0 && Op2Val == 2) {
					Asm = "dc\tcsw";
					insn_id = ARM64_INS_DC;
					op_dc = ARM64_DC_CSW;
				}
				break;
			case 11:
				if (Op1Val == 3 && Op2Val == 1) {
					Asm = "dc\tcvau";
					insn_id = ARM64_INS_DC;
					op_dc = ARM64_DC_CVAU;
				}
				break;
			case 14:
				if (Op1Val == 3 && Op2Val == 1) {
					Asm = "dc\tcivac";
					insn_id = ARM64_INS_DC;
					op_dc = ARM64_DC_CIVAC;
				} else if (Op1Val == 0 && Op2Val == 2) {
					Asm = "dc\tcisw";
					insn_id = ARM64_INS_DC;
					op_dc = ARM64_DC_CISW;
				}
				break;

				// AT aliases
			case 8:
				switch (Op1Val) {
					default:
						break;
					case 0:
						switch (Op2Val) {
							default:
								break;
							case 0: Asm = "at\ts1e1r"; insn_id = ARM64_INS_AT; op_at = ARM64_AT_S1E1R; break;
							case 1: Asm = "at\ts1e1w"; insn_id = ARM64_INS_AT; op_at = ARM64_AT_S1E1W; break;
							case 2: Asm = "at\ts1e0r"; insn_id = ARM64_INS_AT; op_at = ARM64_AT_S1E0R; break;
							case 3: Asm = "at\ts1e0w"; insn_id = ARM64_INS_AT; op_at = ARM64_AT_S1E0W; break;
						}
						break;
					case 4:
						switch (Op2Val) {
							default:
								break;
							case 0: Asm = "at\ts1e2r"; insn_id = ARM64_INS_AT; op_at = ARM64_AT_S1E2R; break;
							case 1: Asm = "at\ts1e2w"; insn_id = ARM64_INS_AT; op_at = ARM64_AT_S1E2W; break;
							case 4: Asm = "at\ts12e1r"; insn_id = ARM64_INS_AT; op_at = ARM64_AT_S1E1R; break;
							case 5: Asm = "at\ts12e1w"; insn_id = ARM64_INS_AT; op_at = ARM64_AT_S1E1W; break;
							case 6: Asm = "at\ts12e0r"; insn_id = ARM64_INS_AT; op_at = ARM64_AT_S1E0R; break;
							case 7: Asm = "at\ts12e0w"; insn_id = ARM64_INS_AT; op_at = ARM64_AT_S1E0W; break;
						}
						break;
					case 6:
						switch (Op2Val) {
							default:
								break;
							case 0: Asm = "at\ts1e3r"; insn_id = ARM64_INS_AT; op_at = ARM64_AT_S1E3R; break;
							case 1: Asm = "at\ts1e3w"; insn_id = ARM64_INS_AT; op_at = ARM64_AT_S1E3W; break;
						}
						break;
				}
				break;
		}
	} else if (CnVal == 8) {
		// TLBI aliases
		switch (CmVal) {
			default:
				break;
			case 3:
				switch (Op1Val) {
					default:
						break;
					case 0:
						switch (Op2Val) {
							default:
								break;
							case 0: Asm = "tlbi\tvmalle1is"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VMALLE1IS; break;
							case 1: Asm = "tlbi\tvae1is"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VAE1IS; break;
							case 2: Asm = "tlbi\taside1is"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_ASIDE1IS; break;
							case 3: Asm = "tlbi\tvaae1is"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VAAE1IS; break;
							case 5: Asm = "tlbi\tvale1is"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VALE1IS; break;
							case 7: Asm = "tlbi\tvaale1is"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VAALE1IS; break;
						}
						break;
					case 4:
						switch (Op2Val) {
							default:
								break;
							case 0: Asm = "tlbi\talle2is"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_ALLE2IS; break;
							case 1: Asm = "tlbi\tvae2is"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VAE2IS; break;
							case 4: Asm = "tlbi\talle1is"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_ALLE1IS; break;
							case 5: Asm = "tlbi\tvale2is"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VALE2IS; break;
							case 6: Asm = "tlbi\tvmalls12e1is"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VMALLS12E1IS; break;
						}
						break;
					case 6:
						switch (Op2Val) {
							default:
								break;
							case 0: Asm = "tlbi\talle3is"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_ALLE3IS; break;
							case 1: Asm = "tlbi\tvae3is"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VAE3IS; break;
							case 5: Asm = "tlbi\tvale3is"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VALE3IS; break;
						}
						break;
				}
				break;
			case 0:
				switch (Op1Val) {
					default:
						break;
					case 4:
						switch (Op2Val) {
							default:
								break;
							case 1: Asm = "tlbi\tipas2e1is"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_IPAS2E1IS; break;
							case 5: Asm = "tlbi\tipas2le1is"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_IPAS2LE1IS; break;
						}
						break;
				}
				break;
			case 4:
				switch (Op1Val) {
					default:
						break;
					case 4:
						switch (Op2Val) {
							default:
								break;
							case 1: Asm = "tlbi\tipas2e1"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_IPAS2E1; break;
							case 5: Asm = "tlbi\tipas2le1"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_IPAS2LE1; break;
						}
						break;
				}
				break;
			case 7:
				switch (Op1Val) {
					default:
						break;
					case 0:
						switch (Op2Val) {
							default:
								break;
							case 0: Asm = "tlbi\tvmalle1"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VMALLE1; break;
							case 1: Asm = "tlbi\tvae1"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VAE1; break;
							case 2: Asm = "tlbi\taside1"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_ASIDE1; break;
							case 3: Asm = "tlbi\tvaae1"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VAAE1; break;
							case 5: Asm = "tlbi\tvale1"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VALE1; break;
							case 7: Asm = "tlbi\tvaale1"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VAALE1; break;
						}
						break;
					case 4:
						switch (Op2Val) {
							default:
								break;
							case 0: Asm = "tlbi\talle2"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_ALLE2; break;
							case 1: Asm = "tlbi\tvae2"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VAE2; break;
							case 4: Asm = "tlbi\talle1"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_ALLE1; break;
							case 5: Asm = "tlbi\tvale2"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VALE2; break;
							case 6: Asm = "tlbi\tvmalls12e1"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VMALLS12E1; break;
						}
						break;
					case 6:
						switch (Op2Val) {
							default:
								break;
							case 0: Asm = "tlbi\talle3"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_ALLE3; break;
							case 1: Asm = "tlbi\tvae3"; insn_id = ARM64_INS_TLBI;  op_tlbi = ARM64_TLBI_VAE3; break;
							case 5: Asm = "tlbi\tvale3"; insn_id = ARM64_INS_TLBI; op_tlbi = ARM64_TLBI_VALE3; break;
						}
						break;
				}
				break;
		}
	}

	if (Asm) {
		MCInst_setOpcodePub(MI, insn_id);
		SStream_concat0(O, Asm);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_SYS;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].sys = op_ic + op_dc + op_at + op_tlbi;
			MI->flat_insn->detail->arm64.op_count++;
		}

		if (!strstr(Asm, "all")) {
			unsigned Reg = MCOperand_getReg(MCInst_getOperand(MI, 4));
			SStream_concat(O, ", %s", getRegisterName(Reg, AArch64_NoRegAltName));
			if (MI->csh->detail) {
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = Reg;
				MI->flat_insn->detail->arm64.op_count++;
			}
		}
	}

	return Asm != NULL;
}